

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinskiplus.h
# Opt level: O2

void ClownLZSS::Internal::KosinskiPlus::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output)

{
  bool bVar1;
  uchar value;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  uint distance;
  BitField<decltype(input)> descriptor_bits;
  
  BitField::
  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
  ::Reader(&descriptor_bits,input);
  do {
    while( true ) {
      bVar1 = BitField::
              Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
              ::Pop(&descriptor_bits);
      if (!bVar1) break;
      value = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::ReadImplementation
                        (&input->
                          super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        );
      DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8192U,_256U,_-1>::
      WriteImplementation(output,value);
    }
    bVar1 = BitField::
            Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
            ::Pop(&descriptor_bits);
    bVar2 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ::ReadImplementation
                      (&input->
                        super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      );
    uVar5 = (uint)bVar2;
    if (bVar1) {
      bVar3 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::ReadImplementation
                        (&input->
                          super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        );
      distance = 0x2000 - ((uVar5 & 0xf8) << 5 | (uint)bVar3);
      if ((bVar2 & 7) == 0) {
        bVar2 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ::ReadImplementation
                          (&input->
                            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          );
        if (bVar2 == 0) {
          return;
        }
        uVar5 = bVar2 + 9;
      }
      else {
        uVar5 = 10 - (uVar5 & 7);
      }
    }
    else {
      distance = 0x100 - uVar5;
      bVar1 = BitField::
              Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
              ::Pop(&descriptor_bits);
      bVar4 = BitField::
              Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
              ::Pop(&descriptor_bits);
      uVar5 = (uint)bVar4 + (uint)bVar1 * 2 + 2;
    }
    DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8192U,_256U,_-1>::Copy
              (output,distance,uVar5);
  } while( true );
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output)
			{
				BitField<decltype(input)> descriptor_bits(input);

				for (;;)
				{
					if (descriptor_bits.Pop())
					{
						output.Write(input.Read());
					}
					else
					{
						unsigned int offset;
						unsigned int count;

						if (descriptor_bits.Pop())
						{
							const unsigned int high_byte = input.Read();
							const unsigned int low_byte = input.Read();

							offset = ((high_byte & 0xF8) << 5) | low_byte;
							offset = 0x2000 - offset;
							count = high_byte & 7;

							if (count != 0)
							{
								count = 10 - count;
							}
							else
							{
								count = input.Read() + 9;

								if (count == 9)
									break;
							}
						}
						else
						{
							offset = 0x100 - input.Read();

							count = 2;

							if (descriptor_bits.Pop())
								count += 2;
							if (descriptor_bits.Pop())
								count += 1;
						}

						output.Copy(offset, count);
					}
				}
			}